

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer_allocator.cpp
# Opt level: O3

UndoBufferReference * __thiscall
duckdb::UndoBufferAllocator::Allocate
          (UndoBufferReference *__return_storage_ptr__,UndoBufferAllocator *this,idx_t alloc_len)

{
  unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true> *this_00;
  idx_t iVar1;
  BufferManager *pBVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> _Var3;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> _Var4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  pointer pUVar8;
  undefined4 extraout_var;
  ulong uVar10;
  type pUVar11;
  BufferHandle handle;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> local_90;
  BufferHandle local_88;
  UndoBufferReference *local_68;
  BufferHandle local_60;
  BufferHandle local_48;
  ulong uVar9;
  
  BufferHandle::BufferHandle(&local_60);
  this_00 = &this->head;
  if ((this->head).
      super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t.
      super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
      .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl !=
      (UndoBufferEntry *)0x0) {
    pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(this_00);
    iVar1 = pUVar8->position;
    pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(this_00);
    if (iVar1 + alloc_len <= pUVar8->capacity) {
      pBVar2 = this->buffer_manager;
      pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               ::operator->(this_00);
      (*pBVar2->_vptr_BufferManager[7])(&local_88,pBVar2,&pUVar8->block);
      BufferHandle::operator=(&local_60,&local_88);
      BufferHandle::~BufferHandle(&local_88);
      goto LAB_017e693e;
    }
  }
  local_68 = __return_storage_ptr__;
  iVar7 = (*this->buffer_manager->_vptr_BufferManager[0xf])();
  uVar9 = CONCAT44(extraout_var,iVar7);
  uVar10 = 0x1000;
  if ((this_00->
      super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>)._M_t
      .super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
      .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl !=
      (UndoBufferEntry *)0x0) {
    uVar10 = uVar9;
  }
  if (0x1000 < alloc_len) {
    uVar10 = uVar9;
  }
  if (uVar10 < alloc_len) {
    uVar10 = NextPowerOfTwo(alloc_len);
  }
  pBVar2 = this->buffer_manager;
  local_90._M_head_impl = (UndoBufferEntry *)operator_new(0x38);
  (local_90._M_head_impl)->buffer_manager = pBVar2;
  ((local_90._M_head_impl)->block).internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_90._M_head_impl)->block).internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_90._M_head_impl)->position = 0;
  (local_90._M_head_impl)->capacity = 0;
  ((local_90._M_head_impl)->next).
  super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>.
  super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl = (UndoBufferEntry *)0x0;
  ((local_90._M_head_impl)->prev).ptr = (UndoBufferEntry *)0x0;
  if (uVar10 < uVar9) {
    (*pBVar2->_vptr_BufferManager[0x13])(&local_88,pBVar2,0xc,uVar10);
    pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)&local_90);
    __return_storage_ptr__ = local_68;
    _Var6._M_pi = local_88.handle.internal.
                  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar5 = local_88.handle.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_88.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (pUVar8->block).internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (pUVar8->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar5;
    (pUVar8->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var6._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if (local_88.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.handle.internal.
                 super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    pBVar2 = this->buffer_manager;
    pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)&local_90);
    (*pBVar2->_vptr_BufferManager[7])(&local_88,pBVar2,&pUVar8->block);
    BufferHandle::operator=(&local_60,&local_88);
    BufferHandle::~BufferHandle(&local_88);
  }
  else {
    (*pBVar2->_vptr_BufferManager[4])(&local_88,pBVar2,0xc,uVar10,0);
    BufferHandle::operator=(&local_60,&local_88);
    BufferHandle::~BufferHandle(&local_88);
    pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)&local_90);
    __return_storage_ptr__ = local_68;
    shared_ptr<duckdb::BlockHandle,_true>::operator=(&pUVar8->block,&local_60.handle);
  }
  pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                       *)&local_90);
  pUVar8->capacity = uVar10;
  pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                       *)&local_90);
  _Var3._M_head_impl = local_90._M_head_impl;
  pUVar8->position = 0;
  if ((this_00->
      super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>)._M_t
      .super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
      .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl ==
      (UndoBufferEntry *)0x0) {
    (this->tail).ptr = local_90._M_head_impl;
  }
  else {
    pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(this_00);
    (pUVar8->prev).ptr = _Var3._M_head_impl;
    pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)&local_90);
    _Var3._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
         .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>)._M_t.
    super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
    .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl = (UndoBufferEntry *)0x0;
    _Var4._M_head_impl =
         (pUVar8->next).
         super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
         .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
    (pUVar8->next).
    super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t.
    super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
    .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var4._M_head_impl != (UndoBufferEntry *)0x0) {
      UndoBufferEntry::~UndoBufferEntry(_Var4._M_head_impl);
      operator_delete(_Var4._M_head_impl);
    }
  }
  _Var4._M_head_impl = local_90._M_head_impl;
  local_90._M_head_impl = (UndoBufferEntry *)0x0;
  _Var3._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
       .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>.
  super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (UndoBufferEntry *)0x0) {
    UndoBufferEntry::~UndoBufferEntry(_Var3._M_head_impl);
    operator_delete(_Var3._M_head_impl);
    _Var3._M_head_impl = local_90._M_head_impl;
    if (local_90._M_head_impl != (UndoBufferEntry *)0x0) {
      UndoBufferEntry::~UndoBufferEntry(local_90._M_head_impl);
      operator_delete(_Var3._M_head_impl);
    }
  }
LAB_017e693e:
  pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->(this_00);
  iVar1 = pUVar8->position;
  pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->(this_00);
  pUVar8->position = pUVar8->position + alloc_len;
  pUVar11 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
            ::operator*(this_00);
  BufferHandle::BufferHandle(&local_48,&local_60);
  (__return_storage_ptr__->entry).ptr = pUVar11;
  BufferHandle::BufferHandle(&__return_storage_ptr__->handle,&local_48);
  __return_storage_ptr__->position = iVar1;
  BufferHandle::~BufferHandle(&local_48);
  BufferHandle::~BufferHandle(&local_60);
  return __return_storage_ptr__;
}

Assistant:

UndoBufferReference UndoBufferAllocator::Allocate(idx_t alloc_len) {
	D_ASSERT(!head || head->position <= head->capacity);
	BufferHandle handle;
	if (!head || head->position + alloc_len > head->capacity) {
		// no space in current head - allocate a new block
		auto block_size = buffer_manager.GetBlockSize();
		;
		idx_t capacity;
		if (!head && alloc_len <= 4096) {
			capacity = 4096;
		} else {
			capacity = block_size;
		}
		if (capacity < alloc_len) {
			capacity = NextPowerOfTwo(alloc_len);
		}
		auto entry = make_uniq<UndoBufferEntry>(buffer_manager);
		if (capacity < block_size) {
			entry->block = buffer_manager.RegisterSmallMemory(MemoryTag::TRANSACTION, capacity);
			handle = buffer_manager.Pin(entry->block);
		} else {
			handle = buffer_manager.Allocate(MemoryTag::TRANSACTION, capacity, false);
			entry->block = handle.GetBlockHandle();
		}
		entry->capacity = capacity;
		entry->position = 0;
		// add block to the chain
		if (head) {
			head->prev = entry.get();
			entry->next = std::move(head);
		} else {
			tail = entry.get();
		}
		head = std::move(entry);
	} else {
		handle = buffer_manager.Pin(head->block);
	}
	idx_t current_position = head->position;
	head->position += alloc_len;
	return UndoBufferReference(*head, std::move(handle), current_position);
}